

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O0

void __thiscall
S2EdgeTessellator::AppendUnprojected
          (S2EdgeTessellator *this,R2Point *pa,R2Point *pb,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  bool bVar1;
  reference a_00;
  ostream *poVar2;
  S2LogMessage local_78;
  S2LogMessageVoidify local_61;
  double local_60;
  undefined1 local_58 [8];
  S2Point b;
  S2Point a;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  R2Point *pb_local;
  R2Point *pa_local;
  S2EdgeTessellator *this_local;
  
  (*this->proj_->_vptr_Projection[3])(b.c_ + 2,this->proj_,pa);
  (*this->proj_->_vptr_Projection[3])(local_58,this->proj_,pb);
  bVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::empty(vertices);
  if (bVar1) {
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              (vertices,(value_type *)(b.c_ + 2));
  }
  else {
    a_00 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::back(vertices);
    local_60 = (double)S1Angle::Radians(1e-15);
    bVar1 = S2::ApproxEquals(a_00,(S2Point *)(b.c_ + 2),(S1Angle)local_60);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xff,kFatal,(ostream *)&std::cerr);
      poVar2 = S2LogMessage::stream(&local_78);
      poVar2 = std::operator<<(poVar2,"Check failed: S2::ApproxEquals(vertices->back(), a) ");
      poVar2 = std::operator<<(poVar2,"Appended edges must form a chain");
      S2LogMessageVoidify::operator&(&local_61,poVar2);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
    }
  }
  AppendUnprojected(this,pa,(S2Point *)(b.c_ + 2),pb,(S2Point *)local_58,vertices);
  return;
}

Assistant:

void S2EdgeTessellator::AppendUnprojected(
    const R2Point& pa, const R2Point& pb, vector<S2Point>* vertices) const {
  S2Point a = proj_.Unproject(pa);
  S2Point b = proj_.Unproject(pb);
  if (vertices->empty()) {
    vertices->push_back(a);
  } else {
    // Note that coordinate wrapping can create a small amount of error.  For
    // example in the edge chain "0:-175, 0:179, 0:-177", the first edge is
    // transformed into "0:-175, 0:-181" while the second is transformed into
    // "0:179, 0:183".  The two coordinate pairs for the middle vertex
    // ("0:-181" and "0:179") may not yield exactly the same S2Point.
    S2_DCHECK(S2::ApproxEquals(vertices->back(), a))
        << "Appended edges must form a chain";
  }
  AppendUnprojected(pa, a, pb, b, vertices);
}